

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::SlopesEqual
               (IntPoint pt1,IntPoint pt2,IntPoint pt3,IntPoint pt4,bool UseFullInt64Range)

{
  Int128 local_a8;
  Int128 local_98;
  Int128 local_88;
  Int128 local_78;
  Int128 local_68;
  Int128 local_58;
  undefined1 local_41;
  long lStack_40;
  bool UseFullInt64Range_local;
  IntPoint pt3_local;
  IntPoint pt2_local;
  IntPoint pt1_local;
  
  pt3_local.X = pt3.Y;
  lStack_40 = pt3.X;
  pt3_local.Y = pt2.X;
  local_41 = UseFullInt64Range;
  if (UseFullInt64Range) {
    Int128::Int128(&local_68,pt1.Y - pt2.Y);
    Int128::Int128(&local_78,lStack_40 - pt4.X);
    Int128::operator*(&local_58,&local_68);
    Int128::Int128(&local_98,pt1.X - pt3_local.Y);
    Int128::Int128(&local_a8,pt3_local.X - pt4.Y);
    Int128::operator*(&local_88,&local_98);
    pt1_local.Y._7_1_ = Int128::operator==(&local_58,&local_88);
  }
  else {
    pt1_local.Y._7_1_ =
         (pt1.Y - pt2.Y) * (lStack_40 - pt4.X) - (pt1.X - pt3_local.Y) * (pt3_local.X - pt4.Y) == 0;
  }
  return pt1_local.Y._7_1_;
}

Assistant:

bool SlopesEqual(const IntPoint pt1, const IntPoint pt2,
  const IntPoint pt3, const IntPoint pt4, bool UseFullInt64Range)
{
  if (UseFullInt64Range)
    return Int128(pt1.Y-pt2.Y) * Int128(pt3.X-pt4.X) ==
      Int128(pt1.X-pt2.X) * Int128(pt3.Y-pt4.Y);
  else return (pt1.Y-pt2.Y)*(pt3.X-pt4.X) == (pt1.X-pt2.X)*(pt3.Y-pt4.Y);
}